

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastunpack28_24(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = *in;
  *out = uVar1 & 0xfffffff;
  out[1] = uVar1 >> 0x1c;
  uVar2 = in[1];
  out[1] = uVar1 >> 0x1c | (uVar2 & 0xffffff) << 4;
  uVar1 = in[2];
  out[2] = uVar2 >> 0x18;
  out[2] = uVar2 >> 0x18 | (uVar1 & 0xfffff) << 8;
  out[3] = uVar1 >> 0x14;
  uVar2 = in[3];
  out[3] = uVar1 >> 0x14 | (uVar2 & 0xffff) << 0xc;
  out[4] = uVar2 >> 0x10;
  uVar1 = in[4];
  out[4] = uVar2 >> 0x10 | (uVar1 & 0xfff) << 0x10;
  uVar2 = in[5];
  out[5] = uVar1 >> 0xc;
  out[5] = uVar1 >> 0xc | (uVar2 & 0xff) << 0x14;
  out[6] = uVar2 >> 8;
  uVar1 = in[6];
  out[6] = uVar2 >> 8 | (uVar1 & 0xf) << 0x18;
  out[7] = uVar1 >> 4;
  uVar1 = in[7];
  out[8] = uVar1 & 0xfffffff;
  out[9] = uVar1 >> 0x1c;
  uVar2 = in[8];
  out[9] = uVar1 >> 0x1c | (uVar2 & 0xffffff) << 4;
  uVar1 = in[9];
  out[10] = uVar2 >> 0x18;
  out[10] = uVar2 >> 0x18 | (uVar1 & 0xfffff) << 8;
  out[0xb] = uVar1 >> 0x14;
  uVar2 = in[10];
  out[0xb] = uVar1 >> 0x14 | (uVar2 & 0xffff) << 0xc;
  out[0xc] = uVar2 >> 0x10;
  uVar1 = in[0xb];
  out[0xc] = uVar2 >> 0x10 | (uVar1 & 0xfff) << 0x10;
  uVar2 = in[0xc];
  out[0xd] = uVar1 >> 0xc;
  out[0xd] = uVar1 >> 0xc | (uVar2 & 0xff) << 0x14;
  out[0xe] = uVar2 >> 8;
  uVar1 = in[0xd];
  out[0xe] = uVar2 >> 8 | (uVar1 & 0xf) << 0x18;
  out[0xf] = uVar1 >> 4;
  uVar1 = in[0xe];
  out[0x10] = uVar1 & 0xfffffff;
  out[0x11] = uVar1 >> 0x1c;
  uVar2 = in[0xf];
  out[0x11] = uVar1 >> 0x1c | (uVar2 & 0xffffff) << 4;
  uVar1 = in[0x10];
  out[0x12] = uVar2 >> 0x18;
  out[0x12] = uVar2 >> 0x18 | (uVar1 & 0xfffff) << 8;
  out[0x13] = uVar1 >> 0x14;
  uVar2 = in[0x11];
  out[0x13] = uVar1 >> 0x14 | (uVar2 & 0xffff) << 0xc;
  out[0x14] = uVar2 >> 0x10;
  uVar1 = in[0x12];
  out[0x14] = uVar2 >> 0x10 | (uVar1 & 0xfff) << 0x10;
  uVar2 = in[0x13];
  out[0x15] = uVar1 >> 0xc;
  out[0x15] = uVar1 >> 0xc | (uVar2 & 0xff) << 0x14;
  out[0x16] = uVar2 >> 8;
  uVar1 = in[0x14];
  out[0x16] = uVar2 >> 8 | (uVar1 & 0xf) << 0x18;
  out[0x17] = uVar1 >> 4;
  return in + 0x15;
}

Assistant:

const uint32_t *__fastunpack28_24(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 28);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 24)) << (28 - 24);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 20)) << (28 - 20);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 16)) << (28 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 12)) << (28 - 12);
  out++;
  *out = ((*in) >> 12);
  ++in;
  *out |= ((*in) % (1U << 8)) << (28 - 8);
  out++;
  *out = ((*in) >> 8);
  ++in;
  *out |= ((*in) % (1U << 4)) << (28 - 4);
  out++;
  *out = ((*in) >> 4);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 28);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 24)) << (28 - 24);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 20)) << (28 - 20);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 16)) << (28 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 12)) << (28 - 12);
  out++;
  *out = ((*in) >> 12);
  ++in;
  *out |= ((*in) % (1U << 8)) << (28 - 8);
  out++;
  *out = ((*in) >> 8);
  ++in;
  *out |= ((*in) % (1U << 4)) << (28 - 4);
  out++;
  *out = ((*in) >> 4);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 28);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 24)) << (28 - 24);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 20)) << (28 - 20);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 16)) << (28 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 12)) << (28 - 12);
  out++;
  *out = ((*in) >> 12);
  ++in;
  *out |= ((*in) % (1U << 8)) << (28 - 8);
  out++;
  *out = ((*in) >> 8);
  ++in;
  *out |= ((*in) % (1U << 4)) << (28 - 4);
  out++;
  *out = ((*in) >> 4);
  ++in;
  out++;

  return in;
}